

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

Vec4 __thiscall
vkt::api::anon_unknown_0::getFormatThreshold(anon_unknown_0 *this,TextureFormat *format)

{
  ChannelType CVar1;
  int i;
  long lVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong in_XMM1_Qa;
  float fVar6;
  float fVar7;
  Vec4 VVar8;
  IVec4 bits;
  undefined8 local_38;
  float fStack_30;
  float fStack_2c;
  int local_28 [2];
  float fStack_20;
  float fStack_1c;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&local_38 + lVar2 * 4) = 0x3c23d70a;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  CVar1 = format->type;
  if ((int)CVar1 < 0x23) {
    if (CVar1 == UNSIGNED_INT_11F_11F_10F_REV) {
      uVar4 = 0x3ca3d70a;
      uVar5 = 0x3ca3d70a;
      fStack_30 = 0.0625;
    }
    else {
      if (CVar1 != UNSIGNED_INT_999_E5_REV) {
        if (CVar1 != HALF_FLOAT) goto LAB_0047bc82;
        lVar2 = 0;
        do {
          local_28[lVar2] = 0x3ba3d70a;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        goto LAB_0047bc5b;
      }
      uVar4 = 0x3d4ccccd;
      uVar5 = 0x3d4ccccd;
      fStack_30 = 0.05;
    }
    local_38 = CONCAT44(uVar5,uVar4);
    fStack_2c = 1.0;
  }
  else {
    if (1 < CVar1 - FLOAT) {
LAB_0047bc82:
      tcu::getTextureFormatMantissaBitDepth((tcu *)local_28,format);
      in_XMM1_Qa = 0x3f800000;
      if (0 < local_28[0]) {
        iVar3 = 0x20;
        if (local_28[0] < 0x20) {
          iVar3 = local_28[0];
        }
        fVar6 = (float)(ulong)(1L << ((byte)iVar3 & 0x3f)) + -1.0;
        in_XMM1_Qa = 0x3f800000;
        if (fVar6 <= 1.0) {
          fVar6 = 1.0;
        }
        if (1.0 / fVar6 <= 1.0) {
          in_XMM1_Qa = (ulong)(uint)(1.0 / fVar6);
        }
      }
      fVar6 = 1.0;
      if (0 < local_28[1]) {
        iVar3 = 0x20;
        if (local_28[1] < 0x20) {
          iVar3 = local_28[1];
        }
        fVar7 = (float)(ulong)(1L << ((byte)iVar3 & 0x3f)) + -1.0;
        if (fVar7 <= 1.0) {
          fVar7 = 1.0;
        }
        fVar6 = 1.0;
        if (1.0 / fVar7 <= 1.0) {
          fVar6 = 1.0 / fVar7;
        }
      }
      fStack_30 = 1.0;
      if (0 < (int)fStack_20) {
        fVar7 = 4.48416e-44;
        if ((int)fStack_20 < 0x20) {
          fVar7 = fStack_20;
        }
        fVar7 = (float)(ulong)(1L << (SUB41(fVar7,0) & 0x3f)) + -1.0;
        if (fVar7 <= 1.0) {
          fVar7 = 1.0;
        }
        fStack_30 = 1.0;
        if (1.0 / fVar7 <= 1.0) {
          fStack_30 = 1.0 / fVar7;
        }
      }
      fStack_2c = 1.0;
      if (0 < (int)fStack_1c) {
        fVar7 = 4.48416e-44;
        if ((int)fStack_1c < 0x20) {
          fVar7 = fStack_1c;
        }
        fVar7 = (float)(ulong)(1L << (SUB41(fVar7,0) & 0x3f)) + -1.0;
        if (fVar7 <= 1.0) {
          fVar7 = 1.0;
        }
        fStack_2c = 1.0;
        if (1.0 / fVar7 <= 1.0) {
          fStack_2c = 1.0 / fVar7;
        }
      }
      local_38._0_4_ = (float)in_XMM1_Qa;
      local_38 = CONCAT44(fVar6,(float)local_38);
      goto LAB_0047be37;
    }
    lVar2 = 0;
    do {
      local_28[lVar2] = 0x3a83126f;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
LAB_0047bc5b:
    local_38 = CONCAT44(local_28[1],local_28[0]);
    fStack_30 = fStack_20;
    fStack_2c = fStack_1c;
  }
LAB_0047be37:
  if ((format->order & ~A) == BGR) {
    in_XMM1_Qa = local_38 & 0xffffffff;
    *(float *)this = fStack_30;
    *(undefined4 *)(this + 4) = local_38._4_4_;
    *(float *)(this + 8) = (float)local_38;
    *(float *)(this + 0xc) = fStack_2c;
    local_38._4_4_ = 0;
  }
  else {
    *(float *)this = (float)local_38;
    *(undefined4 *)(this + 4) = local_38._4_4_;
    *(float *)(this + 8) = fStack_30;
    *(float *)(this + 0xc) = fStack_2c;
    fStack_30 = (float)local_38;
  }
  VVar8.m_data[1] = (float)local_38._4_4_;
  VVar8.m_data[0] = fStack_30;
  VVar8.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar8.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vec4)VVar8.m_data;
}

Assistant:

tcu::Vec4 getFormatThreshold (const tcu::TextureFormat& format)
{
	tcu::Vec4 threshold(0.01f);

	switch (format.type)
	{
	case tcu::TextureFormat::HALF_FLOAT:
		threshold = tcu::Vec4(0.005f);
		break;

	case tcu::TextureFormat::FLOAT:
	case tcu::TextureFormat::FLOAT64:
		threshold = tcu::Vec4(0.001f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		threshold = tcu::Vec4(0.02f, 0.02f, 0.0625f, 1.0f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_999_E5_REV:
		threshold = tcu::Vec4(0.05f, 0.05f, 0.05f, 1.0f);
		break;

	default:
		const tcu::IVec4 bits = tcu::getTextureFormatMantissaBitDepth(format);
		threshold = tcu::Vec4(calculateFloatConversionError(bits.x()),
				      calculateFloatConversionError(bits.y()),
				      calculateFloatConversionError(bits.z()),
				      calculateFloatConversionError(bits.w()));
	}

	// Return value matching the channel order specified by the format
	if (format.order == tcu::TextureFormat::BGR || format.order == tcu::TextureFormat::BGRA)
		return threshold.swizzle(2, 1, 0, 3);
	else
		return threshold;
}